

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O3

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
               (TSTNode<unsigned_char> *node,size_t depth)

{
  uchar uVar1;
  byte bVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  undefined1 extraout_AL;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  DI __d;
  uchar local_51;
  TSTNode<unsigned_char> *local_50;
  long local_48;
  DI local_40;
  size_t local_38;
  
  uVar1 = node->pivot;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_tst",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() pivot=",9);
  local_50 = node;
  if (uVar1 == '\0') {
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)node->pivot);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," depth=",7);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  else {
    local_40.i._0_1_ = node->pivot;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_40,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," depth=",7);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  local_40.i._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_40,1);
  local_40.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_38 = depth;
  if (((local_50->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
    plVar3 = (long *)(local_50->buckets)._M_elems[0];
    if (plVar3 == (long *)0x0) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] == NULL",9);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
    }
    else {
      lVar9 = *plVar3;
      lVar4 = plVar3[1];
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].size()=",9);
      lVar10 = lVar4 - lVar9 >> 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
      if (lVar4 != lVar9) {
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        lVar9 = 0;
        local_48 = lVar10;
        do {
          lVar4 = *(long *)(*plVar3 + lVar9 * 8);
          if (lVar4 == 0) goto LAB_002151bb;
          bVar2 = *(byte *)(lVar4 + depth);
          bVar6 = local_50->pivot;
          if (bVar6 <= bVar2) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"INVALID: ",9);
            pcVar5 = *(char **)(*plVar3 + lVar9 * 8);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [pivot=",8);
            local_51 = local_50->pivot;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            local_51 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
            bVar6 = local_50->pivot;
            depth = local_38;
            lVar10 = local_48;
          }
          if (bVar6 <= bVar2) {
            __assert_fail("ch < node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xb7,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
    }
  }
  else {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] is TST",8);
    local_51 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
              ((TSTNode<unsigned_char> *)(local_50->buckets)._M_elems[0],depth);
  }
  if (((local_50->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
    plVar3 = (long *)(local_50->buckets)._M_elems[1];
    if (plVar3 == (long *)0x0) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] == NULL",9);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
    }
    else {
      lVar9 = *plVar3;
      lVar4 = plVar3[1];
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].size()=",9);
      lVar10 = lVar4 - lVar9 >> 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
      if (lVar4 != lVar9) {
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        lVar9 = 0;
        local_48 = lVar10;
        do {
          lVar4 = *(long *)(*plVar3 + lVar9 * 8);
          if (lVar4 == 0) goto LAB_002151bb;
          uVar1 = *(uchar *)(lVar4 + depth);
          if (uVar1 != local_50->pivot) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"INVALID: ",9);
            pcVar5 = *(char **)(*plVar3 + lVar9 * 8);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [pivot=",8);
            local_51 = local_50->pivot;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            local_51 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
            depth = local_38;
            lVar10 = local_48;
            if (uVar1 != local_50->pivot) {
              __assert_fail("ch == node->pivot",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                            ,0xbd,
                            "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                           );
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
    }
  }
  else {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] is TST",8);
    local_51 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
              ((TSTNode<unsigned_char> *)(local_50->buckets)._M_elems[1],depth + 1);
  }
  if (((local_50->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
    plVar3 = (long *)(local_50->buckets)._M_elems[2];
    if (plVar3 == (long *)0x0) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] == NULL",9);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
    }
    else {
      lVar9 = *plVar3;
      lVar4 = plVar3[1];
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].size()=",9);
      lVar10 = lVar4 - lVar9 >> 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
      if (lVar4 != lVar9) {
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        lVar9 = 0;
        local_48 = lVar10;
        do {
          lVar4 = *(long *)(*plVar3 + lVar9 * 8);
          if (lVar4 == 0) {
LAB_002151bb:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x26,"unsigned char get_char(unsigned char *, size_t)");
          }
          bVar2 = *(byte *)(lVar4 + depth);
          bVar6 = local_50->pivot;
          if (bVar2 <= bVar6) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"INVALID: ",9);
            pcVar5 = *(char **)(*plVar3 + lVar9 * 8);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [pivot=",8);
            local_51 = local_50->pivot;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            local_51 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
            bVar6 = local_50->pivot;
            depth = local_38;
            lVar10 = local_48;
          }
          if (bVar2 <= bVar6) {
            __assert_fail("ch > node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xc3,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
    }
  }
  else {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] is TST",8);
    local_51 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_51,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
              ((TSTNode<unsigned_char> *)(local_50->buckets)._M_elems[2],depth);
  }
  verify_tst<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_unsigned_char>::DI::~DI
            (&local_40);
  return (bool)extraout_AL;
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}